

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O0

void __thiscall BufferTest_Resize_Test::TestBody(BufferTest_Resize_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  char *pcVar5;
  MockSpec<void_(unsigned_long)> *this_00;
  char *message;
  mock_buffer<char> *this_01;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  mock_buffer<char> buffer;
  char data [123];
  Matcher<unsigned_long> *in_stack_fffffffffffffcc8;
  mock_buffer<char> *in_stack_fffffffffffffcd0;
  uint *in_stack_fffffffffffffcd8;
  char *in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce8;
  int in_stack_fffffffffffffcec;
  int line;
  mock_buffer<char> *in_stack_fffffffffffffcf0;
  undefined8 in_stack_fffffffffffffcf8;
  Type type;
  undefined7 in_stack_fffffffffffffd00;
  undefined1 in_stack_fffffffffffffd07;
  char *in_stack_fffffffffffffd08;
  undefined7 in_stack_fffffffffffffd10;
  undefined7 in_stack_fffffffffffffd48;
  undefined1 in_stack_fffffffffffffd4f;
  AssertHelper *in_stack_fffffffffffffd50;
  char *in_stack_fffffffffffffdc0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffdd4;
  char *in_stack_fffffffffffffdd8;
  AssertionResult local_210 [2];
  size_t local_1f0;
  undefined4 local_1e4;
  AssertionResult local_1e0 [2];
  undefined4 local_1bc;
  AssertionResult local_1b8 [2];
  size_t local_198;
  undefined4 local_18c;
  AssertionResult local_188 [2];
  size_t local_168;
  undefined4 local_15c;
  AssertionResult local_158 [2];
  undefined4 local_134;
  AssertionResult local_130 [2];
  basic_buffer<char> local_110 [8];
  
  type = (Type)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
  mock_buffer<char>::mock_buffer
            (in_stack_fffffffffffffcf0,
             (char *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
             (size_t)in_stack_fffffffffffffce0);
  pcVar5 = fmt::v5::internal::basic_buffer<char>::operator[](local_110,10);
  *pcVar5 = '*';
  local_134 = 0x2a;
  fmt::v5::internal::basic_buffer<char>::operator[](local_110,10);
  testing::internal::EqHelper<false>::Compare<int,char>
            ((char *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
             in_stack_fffffffffffffce0,(int *)in_stack_fffffffffffffcd8,
             (char *)in_stack_fffffffffffffcd0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_130);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
    in_stack_fffffffffffffd50 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x11f612);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),type,
               (char *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec,in_stack_fffffffffffffce0
              );
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffd50,
               (Message *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcd0);
    testing::Message::~Message((Message *)0x11f675);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11f6cd);
  fmt::v5::internal::basic_buffer<char>::resize
            (&in_stack_fffffffffffffcd0->super_basic_buffer<char>,(size_t)in_stack_fffffffffffffcc8)
  ;
  local_15c = 0x14;
  local_168 = fmt::v5::internal::basic_buffer<char>::size(local_110);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
            ((char *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
             in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
             (unsigned_long *)in_stack_fffffffffffffcd0);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_158);
  if (!(bool)uVar2) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
    testing::AssertionResult::failure_message((AssertionResult *)0x11f79d);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),type,
               (char *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec,in_stack_fffffffffffffce0
              );
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffd50,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffd48));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcd0);
    testing::Message::~Message((Message *)0x11f7fa);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11f84f);
  local_18c = 0x7b;
  local_198 = fmt::v5::internal::basic_buffer<char>::capacity(local_110);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
            ((char *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
             in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
             (unsigned_long *)in_stack_fffffffffffffcd0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_188);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
    testing::AssertionResult::failure_message((AssertionResult *)0x11f905);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),type,
               (char *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec,in_stack_fffffffffffffce0
              );
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffd50,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffd48));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcd0);
    testing::Message::~Message((Message *)0x11f962);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11f9b7);
  local_1bc = 0x2a;
  fmt::v5::internal::basic_buffer<char>::operator[](local_110,10);
  testing::internal::EqHelper<false>::Compare<int,char>
            ((char *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
             in_stack_fffffffffffffce0,(int *)in_stack_fffffffffffffcd8,
             (char *)in_stack_fffffffffffffcd0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1b8);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
    testing::AssertionResult::failure_message((AssertionResult *)0x11fa6e);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),type,
               (char *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec,in_stack_fffffffffffffce0
              );
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffd50,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffd48));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcd0);
    testing::Message::~Message((Message *)0x11facb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11fb23);
  fmt::v5::internal::basic_buffer<char>::resize
            (&in_stack_fffffffffffffcd0->super_basic_buffer<char>,(size_t)in_stack_fffffffffffffcc8)
  ;
  local_1e4 = 5;
  local_1f0 = fmt::v5::internal::basic_buffer<char>::size(local_110);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
            ((char *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
             in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
             (unsigned_long *)in_stack_fffffffffffffcd0);
  uVar3 = testing::AssertionResult::operator_cast_to_bool(local_1e0);
  if (!(bool)uVar3) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
    in_stack_fffffffffffffd08 =
         testing::AssertionResult::failure_message((AssertionResult *)0x11fbed);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),type,
               (char *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec,in_stack_fffffffffffffce0
              );
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffd50,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffd48));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcd0);
    testing::Message::~Message((Message *)0x11fc4a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11fc9f);
  this_00 = (MockSpec<void_(unsigned_long)> *)
            fmt::v5::internal::basic_buffer<char>::capacity(local_110);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
            ((char *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
             in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
             (unsigned_long *)in_stack_fffffffffffffcd0);
  uVar4 = testing::AssertionResult::operator_cast_to_bool(local_210);
  if (!(bool)uVar4) {
    testing::Message::Message((Message *)CONCAT17(uVar4,in_stack_fffffffffffffd00));
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x11fd55);
    type = (Type)((ulong)pcVar5 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar4,in_stack_fffffffffffffd00),type,
               (char *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec,in_stack_fffffffffffffce0
              );
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffd50,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffd48));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcd0);
    testing::Message::~Message((Message *)0x11fdb2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11fe07);
  pcVar5 = fmt::v5::internal::basic_buffer<char>::operator[](local_110,10);
  testing::internal::EqHelper<false>::Compare<int,char>
            ((char *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
             in_stack_fffffffffffffce0,(int *)in_stack_fffffffffffffcd8,
             (char *)in_stack_fffffffffffffcd0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffdc0);
  line = CONCAT13(bVar1,(int3)in_stack_fffffffffffffcec);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT17(uVar4,in_stack_fffffffffffffd00));
    message = testing::AssertionResult::failure_message((AssertionResult *)0x11febe);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar4,in_stack_fffffffffffffd00),type,pcVar5,line,message);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffd50,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffd48));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcd0);
    testing::Message::~Message((Message *)0x11ff1b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11ff73);
  testing::Matcher<unsigned_long>::Matcher
            ((Matcher<unsigned_long> *)CONCAT17(uVar3,in_stack_fffffffffffffd10),
             (unsigned_long)in_stack_fffffffffffffd08);
  mock_buffer<char>::gmock_do_grow(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  testing::internal::MockSpec<void_(unsigned_long)>::InternalExpectedAt
            (this_00,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd4,
             (char *)in_stack_fffffffffffffdc8.ptr_,in_stack_fffffffffffffdc0);
  testing::Matcher<unsigned_long>::~Matcher((Matcher<unsigned_long> *)0x11ffd6);
  fmt::v5::internal::basic_buffer<char>::resize
            (&in_stack_fffffffffffffcd0->super_basic_buffer<char>,(size_t)in_stack_fffffffffffffcc8)
  ;
  testing::Matcher<unsigned_long>::Matcher
            ((Matcher<unsigned_long> *)CONCAT17(uVar3,in_stack_fffffffffffffd10),
             (unsigned_long)in_stack_fffffffffffffd08);
  this_01 = (mock_buffer<char> *)
            mock_buffer<char>::gmock_do_grow(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  testing::internal::MockSpec<void_(unsigned_long)>::InternalExpectedAt
            (this_00,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd4,
             (char *)in_stack_fffffffffffffdc8.ptr_,in_stack_fffffffffffffdc0);
  testing::Matcher<unsigned_long>::~Matcher((Matcher<unsigned_long> *)0x12004d);
  fmt::v5::internal::basic_buffer<char>::resize
            (&this_01->super_basic_buffer<char>,(size_t)in_stack_fffffffffffffcc8);
  mock_buffer<char>::~mock_buffer(this_01);
  return;
}

Assistant:

TEST(BufferTest, Resize) {
  char data[123];
  mock_buffer<char> buffer(data, sizeof(data));
  buffer[10] = 42;
  EXPECT_EQ(42, buffer[10]);
  buffer.resize(20);
  EXPECT_EQ(20u, buffer.size());
  EXPECT_EQ(123u, buffer.capacity());
  EXPECT_EQ(42, buffer[10]);
  buffer.resize(5);
  EXPECT_EQ(5u, buffer.size());
  EXPECT_EQ(123u, buffer.capacity());
  EXPECT_EQ(42, buffer[10]);
  // Check if resize calls grow.
  EXPECT_CALL(buffer, do_grow(124));
  buffer.resize(124);
  EXPECT_CALL(buffer, do_grow(200));
  buffer.resize(200);
}